

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_alloc.c
# Opt level: O0

string_alloc_t * string_pool_create(size_t max_length)

{
  string_alloc_t *a_str;
  size_t max_length_local;
  
  max_length_local = (size_t)malloc(0x18);
  if ((undefined8 *)max_length_local == (undefined8 *)0x0) {
    max_length_local = 0;
  }
  else {
    a_str = (string_alloc_t *)max_length;
    if (max_length < 0x400) {
      a_str = (string_alloc_t *)0x400;
    }
    *(undefined8 *)(max_length_local + 8) = 0;
    *(string_alloc_t **)max_length_local = a_str;
    *(undefined8 *)(max_length_local + 0x10) = 0;
  }
  return (string_alloc_t *)max_length_local;
}

Assistant:

string_alloc_t *string_pool_create(size_t max_length) {
    string_alloc_t *a_str;
    
    if (NULL == (a_str = (string_alloc_t *)malloc(sizeof(*a_str)))) {
    	return NULL;
    }
    
    if (max_length < MIN_STR_SIZE) max_length = MIN_STR_SIZE;
    
    a_str->nstrings    = 0;
    a_str->max_length  = max_length;
    a_str->strings     = NULL;
    
    return a_str;
}